

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

LY_ERR ylib_feature(lyd_node *parent,lysp_module *pmod)

{
  lysp_include *plVar1;
  LY_ERR LVar2;
  ulong uVar3;
  lysp_feature *plVar4;
  ulong uVar5;
  lysp_feature *plVar6;
  lysp_feature *plVar7;
  
  if (pmod->mod->implemented != '\0') {
    plVar4 = pmod->features;
    plVar6 = plVar4;
    for (plVar7 = plVar4;
        (plVar6 != (lysp_feature *)0x0 &&
        ((ulong)((long)plVar7 - (long)plVar6) >> 6 < *(ulong *)&plVar6[-1].flags));
        plVar7 = plVar7 + 1) {
      if (((plVar4->flags & 0x20) != 0) &&
         (LVar2 = lyd_new_term(parent,(lys_module *)0x0,"feature",plVar4->name,0,(lyd_node **)0x0),
         LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
      plVar4 = plVar4 + 1;
      plVar6 = pmod->features;
    }
    uVar5 = 0;
    while( true ) {
      plVar1 = pmod->includes;
      if (plVar1 == (lysp_include *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ulong *)(plVar1[-1].rev + 8);
      }
      if (uVar3 <= uVar5) break;
      plVar4 = (pmod->includes[uVar5].submodule)->features;
      if (plVar4 != (lysp_feature *)0x0) {
        plVar6 = (plVar1[uVar5].submodule)->features;
        plVar7 = plVar6;
        do {
          if (*(ulong *)&plVar4[-1].flags <= (ulong)((long)plVar6 - (long)plVar4) >> 6) break;
          if (((plVar7->flags & 0x20) != 0) &&
             (LVar2 = lyd_new_term(parent,(lys_module *)0x0,"feature",plVar7->name,0,
                                   (lyd_node **)0x0), LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
          plVar7 = plVar7 + 1;
          plVar4 = (pmod->includes[uVar5].submodule)->features;
          plVar6 = plVar6 + 1;
        } while (plVar4 != (lysp_feature *)0x0);
      }
      uVar5 = uVar5 + 1;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
ylib_feature(struct lyd_node *parent, const struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_feature *f;

    if (!pmod->mod->implemented) {
        /* no features can be enabled */
        return LY_SUCCESS;
    }

    LY_ARRAY_FOR(pmod->features, struct lysp_feature, f) {
        if (!(f->flags & LYS_FENABLED)) {
            continue;
        }

        LY_CHECK_RET(lyd_new_term(parent, NULL, "feature", f->name, 0, NULL));
    }

    LY_ARRAY_FOR(pmod->includes, u) {
        LY_ARRAY_FOR(pmod->includes[u].submodule->features, struct lysp_feature, f) {
            if (!(f->flags & LYS_FENABLED)) {
                continue;
            }

            LY_CHECK_RET(lyd_new_term(parent, NULL, "feature", f->name, 0, NULL));
        }
    }

    return LY_SUCCESS;
}